

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O3

void __thiscall validation_layer::eventsChecker::eventsChecker(eventsChecker *this)

{
  iterator __position;
  long lVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  validationChecker *local_18;
  
  this->enableEvents = false;
  pbVar2 = (byte *)getenv("ZEL_ENABLE_EVENTS_CHECKER");
  if ((pbVar2 != (byte *)0x0) && (*pbVar2 != 0x30)) {
    uVar5 = *pbVar2 - 0x31;
    if (uVar5 == 0) {
      uVar5 = (uint)pbVar2[1];
    }
    this->enableEvents = uVar5 == 0;
    if (uVar5 == 0) {
      puVar3 = (undefined8 *)operator_new(0x80);
      *puVar3 = &PTR_zeInitPrologue_001e1c70;
      xla::GraphCycles::GraphCycles((GraphCycles *)(puVar3 + 1));
      puVar3[2] = puVar3 + 8;
      puVar3[3] = 1;
      puVar3[4] = 0;
      puVar3[5] = 0;
      *(undefined4 *)(puVar3 + 6) = 0x3f800000;
      puVar3[7] = 0;
      puVar3[8] = 0;
      puVar3[9] = puVar3 + 0xf;
      puVar3[10] = 1;
      puVar3[0xb] = 0;
      puVar3[0xc] = 0;
      *(undefined4 *)(puVar3 + 0xd) = 0x3f800000;
      puVar3[0xe] = 0;
      puVar3[0xf] = 0;
      puVar4 = (undefined8 *)operator_new(8);
      *puVar4 = &PTR_zesInitPrologue_001e2958;
      DAT_001e8580 = (undefined8 *)operator_new(8);
      *DAT_001e8580 = &PTR_zetModuleGetDebugInfoPrologue_001e32e0;
      lVar1 = context;
      local_18 = (validationChecker *)&events_checker;
      __position._M_current = *(validationChecker ***)(context + 0xd38);
      events_checker = puVar3;
      DAT_001e8578 = puVar4;
      if (__position._M_current == *(validationChecker ***)(context + 0xd40)) {
        std::
        vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
        ::_M_realloc_insert<validation_layer::validationChecker*>
                  ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                    *)(context + 0xd30),__position,&local_18);
      }
      else {
        *__position._M_current = (validationChecker *)&events_checker;
        *(long *)(lVar1 + 0xd38) = *(long *)(lVar1 + 0xd38) + 8;
      }
    }
  }
  return;
}

Assistant:

eventsChecker::eventsChecker() {

    enableEvents = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
    if (enableEvents) {
        eventsChecker::ZEeventsChecker *zeChecker = new eventsChecker::ZEeventsChecker;
        eventsChecker::ZESeventsChecker *zesChecker = new eventsChecker::ZESeventsChecker;
        eventsChecker::ZETeventsChecker *zetChecker = new eventsChecker::ZETeventsChecker;
        events_checker.zeValidation = zeChecker;
        events_checker.zesValidation = zesChecker;
        events_checker.zetValidation = zetChecker;

        validation_layer::context.validationHandlers.push_back(&events_checker);
    }
}